

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringNew *curr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Literal *pLVar3;
  uint64_t uVar4;
  long lVar5;
  Literal *x;
  shared_ptr<wasm::GCData> sVar6;
  undefined1 local_190 [8];
  Flow ptr;
  Flow start;
  Flow end;
  Literals contents;
  undefined1 local_68 [8];
  HeapType heapType;
  Type local_50;
  undefined1 local_48 [8];
  shared_ptr<wasm::GCData> ptrData;
  
  visit((Flow *)local_190,this,curr->ptr);
  uVar2 = NONCONSTANT_FLOW._8_8_;
  uVar1 = NONCONSTANT_FLOW._0_8_;
  if (ptr.breakTo.super_IString.str._M_len == 0) {
    if (curr->op == StringNewWTF16Array) {
      visit((Flow *)&ptr.breakTo.super_IString.str._M_str,this,curr->start);
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)&start.breakTo.super_IString.str._M_str,this,curr->end);
        if (end.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)local_190);
          sVar6 = Literal::getGCData((Literal *)local_48);
          ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
          if (local_48 == (undefined1  [8])0x0) {
            (*this->_vptr_ExpressionRunner[2])
                      (this,"null ref",
                       sVar6.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
            ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
          }
          pLVar3 = Flow::getSingleValue((Flow *)&ptr.breakTo.super_IString.str._M_str);
          uVar4 = Literal::getUnsigned(pLVar3);
          pLVar3 = Flow::getSingleValue((Flow *)&start.breakTo.super_IString.str._M_str);
          local_50.id = Literal::getUnsigned(pLVar3);
          lVar5 = (long)ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[3]._vptr__Sp_counted_base -
                  *(long *)&ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[2]._M_use_count;
          if ((ulong)(lVar5 / 0x18 +
                     *(long *)&(ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_M_use_count) < local_50.id) {
            (*this->_vptr_ExpressionRunner[2])(this,"array oob",lVar5 % 0x18);
          }
          contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
          contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
          contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
          super_IString.str._M_str = (char *)0x0;
          end.breakTo.super_IString.str._M_str = (char *)0x0;
          contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          if (uVar4 <= local_50.id && local_50.id - uVar4 != 0) {
            SmallVector<wasm::Literal,_1UL>::reserve
                      ((SmallVector<wasm::Literal,_1UL> *)&end.breakTo.super_IString.str._M_str,
                       local_50.id - uVar4);
            pLVar3 = (Literal *)
                     (ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 1);
            lVar5 = uVar4 * 0x18 + -0x18;
            for (; uVar4 < local_50.id; uVar4 = uVar4 + 1) {
              x = (Literal *)
                  (*(long *)&ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[2]._M_use_count + lVar5);
              if (uVar4 == 0) {
                x = pLVar3;
              }
              SmallVector<wasm::Literal,_1UL>::push_back
                        ((SmallVector<wasm::Literal,_1UL> *)&end.breakTo.super_IString.str._M_str,x)
              ;
              lVar5 = lVar5 + 0x18;
            }
          }
          local_68 = (undefined1  [8])
                     wasm::Type::getHeapType
                               (&(curr->super_SpecificExpression<(wasm::Expression::Id)73>).
                                 super_Expression.type);
          std::make_shared<wasm::GCData,wasm::HeapType&,wasm::Literals&>
                    (&heapType,(Literals *)local_68);
          Literal::Literal((Literal *)
                           &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (shared_ptr<wasm::GCData> *)&heapType,(HeapType)local_68);
          Flow::Flow(__return_storage_ptr__,
                     (Literal *)
                     &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          Literal::~Literal((Literal *)
                            &contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8);
          SmallVector<wasm::Literal,_1UL>::~SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)&end.breakTo.super_IString.str._M_str);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptrData);
        }
        else {
          Flow::Flow(__return_storage_ptr__,(Flow *)&start.breakTo.super_IString.str._M_str);
        }
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&start.breakTo.super_IString.str._M_str);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&ptr.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&ptr.breakTo.super_IString.str._M_str);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.func.super_IString.str._M_str = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar1;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)uVar2;
    }
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_190);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_190);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringNew(StringNew* curr) {
    Flow ptr = visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    switch (curr->op) {
      case StringNewWTF16Array: {
        Flow start = visit(curr->start);
        if (start.breaking()) {
          return start;
        }
        Flow end = visit(curr->end);
        if (end.breaking()) {
          return end;
        }
        auto ptrData = ptr.getSingleValue().getGCData();
        if (!ptrData) {
          trap("null ref");
        }
        const auto& ptrDataValues = ptrData->values;
        size_t startVal = start.getSingleValue().getUnsigned();
        size_t endVal = end.getSingleValue().getUnsigned();
        if (endVal > ptrDataValues.size()) {
          trap("array oob");
        }
        Literals contents;
        if (endVal > startVal) {
          contents.reserve(endVal - startVal);
          for (size_t i = startVal; i < endVal; i++) {
            contents.push_back(ptrDataValues[i]);
          }
        }
        auto heapType = curr->type.getHeapType();
        return Literal(std::make_shared<GCData>(heapType, contents), heapType);
      }
      default:
        // TODO: others
        return Flow(NONCONSTANT_FLOW);
    }
  }